

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserInputPtr
xmlCtxtNewInputFromIO
          (xmlParserCtxtPtr ctxt,char *url,xmlInputReadCallback ioRead,xmlInputCloseCallback ioClose
          ,void *ioCtxt,char *encoding,xmlParserInputFlags flags)

{
  xmlParserInputPtr input;
  
  if (ioRead != (xmlInputReadCallback)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    input = xmlNewInputFromIO(url,ioRead,ioClose,ioCtxt,(xmlParserInputFlags)ioCtxt);
    if (input != (xmlParserInputPtr)0x0) {
      if (encoding == (char *)0x0) {
        return input;
      }
      xmlSwitchInputEncodingName(ctxt,input,encoding);
      return input;
    }
    xmlCtxtErrMemory(ctxt);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromIO(xmlParserCtxtPtr ctxt, const char *url,
                      xmlInputReadCallback ioRead,
                      xmlInputCloseCallback ioClose,
                      void *ioCtxt, const char *encoding,
                      xmlParserInputFlags flags) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (ioRead == NULL))
	return(NULL);

    input = xmlNewInputFromIO(url, ioRead, ioClose, ioCtxt, flags);
    if (input == NULL) {
        xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}